

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<unsigned_long,_unsigned_long> *params,unsigned_long *params_1,
          unsigned_long *params_2)

{
  undefined4 in_register_00000014;
  unsigned_long *params_00;
  unsigned_long *params_01;
  ArrayDisposer **local_e0;
  undefined1 local_78 [8];
  String argValues [3];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  argValues[2].content.disposer = (ArrayDisposer *)macroArgs;
  str<kj::_::DebugComparison<unsigned_long,unsigned_long>&>
            ((String *)local_78,(kj *)params,
             (DebugComparison<unsigned_long,_unsigned_long> *)CONCAT44(in_register_00000014,line));
  str<unsigned_long&>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<unsigned_long&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  arrayPtr<kj::String>((String *)local_78,3);
  init(this,(EVP_PKEY_CTX *)file);
  local_e0 = &argValues[2].content.disposer;
  do {
    local_e0 = local_e0 + -3;
    String::~String((String *)local_e0);
  } while (local_e0 != (ArrayDisposer **)local_78);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}